

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderBullet(ImVec2 pos)

{
  float fVar1;
  ImDrawList *this;
  undefined4 uVar2;
  undefined4 uVar3;
  ImU32 col;
  ImVec2 local_30;
  ImVec4 local_28;
  
  fVar1 = GImGui->FontSize;
  this = GImGui->CurrentWindow->DrawList;
  local_28.x = (GImGui->Style).Colors[0].x;
  local_28.y = (GImGui->Style).Colors[0].y;
  uVar2 = (GImGui->Style).Colors[0].z;
  uVar3 = (GImGui->Style).Colors[0].w;
  local_28.w = (GImGui->Style).Alpha * (float)uVar3;
  local_28.z = (float)uVar2;
  col = ColorConvertFloat4ToU32(&local_28);
  ImDrawList::AddCircleFilled(this,&local_30,fVar1 * 0.2,col,8);
  return;
}

Assistant:

void ImGui::RenderBullet(ImVec2 pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddCircleFilled(pos, GImGui->FontSize*0.20f, GetColorU32(ImGuiCol_Text), 8);
}